

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_linux.c
# Opt level: O2

ATimeUs aAppTime(void)

{
  __time_t _Var1;
  __syscall_slong_t _Var2;
  timespec ts;
  
  clock_gettime(1,(timespec *)&ts);
  _Var1 = a__time_start.tv_sec;
  _Var2 = a__time_start.tv_nsec;
  if (a__time_start.tv_nsec == 0 && a__time_start.tv_sec == 0) {
    _Var1 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
    a__time_start.tv_nsec = ts.tv_nsec;
    a__time_start.tv_sec = _Var1;
    _Var2 = ts.tv_nsec;
  }
  return (int)((ts.tv_nsec - _Var2) / 1000) + ((int)ts.tv_sec - (int)_Var1) * 1000000;
}

Assistant:

ATimeUs aAppTime(void) {
	struct timespec ts;
	clock_gettime(CLOCK_MONOTONIC, &ts);
	if (a__time_start.tv_sec == 0 && a__time_start.tv_nsec == 0)
		a__time_start = ts;
	return //
		(ts.tv_sec - a__time_start.tv_sec) * 1000000 + //
		(ts.tv_nsec - a__time_start.tv_nsec) / 1000;
}